

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16781328,_true,_embree::sse42::VirtualCurveIntersectorK<4>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  long lVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  char cVar17;
  AABBNodeMB4D *node1;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong *puVar23;
  ulong *puVar24;
  ulong uVar25;
  ulong uVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar44;
  float fVar46;
  vint4 bi;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar45;
  float fVar47;
  float fVar48;
  float fVar49;
  undefined1 auVar43 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar54;
  float fVar58;
  float fVar59;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar60;
  undefined1 auVar57 [16];
  float fVar61;
  float fVar62;
  float fVar64;
  float fVar65;
  float fVar66;
  undefined1 auVar63 [16];
  float fVar67;
  vint4 bi_1;
  float fVar68;
  vint4 ai;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  vint4 ai_3;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  vint4 ai_1;
  float fVar78;
  float fVar79;
  float fVar82;
  float fVar83;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar84;
  float fVar85;
  float fVar88;
  float fVar89;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar90;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  NodeRef stack [244];
  size_t local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = root.ptr;
  fVar5 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar6 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar7 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar8 = *(float *)((long)&(tray->dir).field_0 + k * 4);
  fVar9 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fVar10 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar37 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar61 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar67 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar69 = fVar37 * 0.99999964;
  fVar74 = fVar61 * 0.99999964;
  fVar68 = fVar67 * 0.99999964;
  fVar37 = fVar37 * 1.0000004;
  fVar61 = fVar61 * 1.0000004;
  fVar67 = fVar67 * 1.0000004;
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar26 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar22 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar27 = (tray->tnear).field_0.i[k];
  auVar80._4_4_ = iVar27;
  auVar80._0_4_ = iVar27;
  auVar80._8_4_ = iVar27;
  auVar80._12_4_ = iVar27;
  iVar27 = (tray->tfar).field_0.i[k];
  auVar86._4_4_ = iVar27;
  auVar86._0_4_ = iVar27;
  auVar86._8_4_ = iVar27;
  auVar86._12_4_ = iVar27;
  puVar24 = local_7d0;
LAB_00724331:
  puVar23 = puVar24;
  if (puVar23 == &local_7d8) {
LAB_007248a8:
    return puVar23 != &local_7d8;
  }
  puVar24 = puVar23 + -1;
  uVar25 = puVar23[-1];
  do {
    fVar11 = *(float *)(ray + k * 4 + 0x70);
    fVar31 = 1.0 - fVar11;
    fVar32 = fVar31 * 0.0;
    do {
      if ((uVar25 & 8) != 0) {
        cVar17 = (**(code **)((long)This->leafIntersector +
                             (ulong)*(byte *)(uVar25 & 0xfffffffffffffff0) * 0x40 + 0x18))
                           (pre,ray,k,context);
        if (cVar17 == '\0') goto LAB_00724331;
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        goto LAB_007248a8;
      }
      uVar19 = (uint)uVar25 & 7;
      uVar18 = uVar25 & 0xfffffffffffffff0;
      if (uVar19 == 3) {
        auVar42._0_4_ = fVar9 * *(float *)(uVar18 + 0x70) + fVar10 * *(float *)(uVar18 + 0xa0);
        auVar42._4_4_ = fVar9 * *(float *)(uVar18 + 0x74) + fVar10 * *(float *)(uVar18 + 0xa4);
        auVar42._8_4_ = fVar9 * *(float *)(uVar18 + 0x78) + fVar10 * *(float *)(uVar18 + 0xa8);
        auVar42._12_4_ = fVar9 * *(float *)(uVar18 + 0x7c) + fVar10 * *(float *)(uVar18 + 0xac);
        auVar81._0_4_ =
             fVar8 * *(float *)(uVar18 + 0x20) +
             fVar9 * *(float *)(uVar18 + 0x50) + fVar10 * *(float *)(uVar18 + 0x80);
        auVar81._4_4_ =
             fVar8 * *(float *)(uVar18 + 0x24) +
             fVar9 * *(float *)(uVar18 + 0x54) + fVar10 * *(float *)(uVar18 + 0x84);
        auVar81._8_4_ =
             fVar8 * *(float *)(uVar18 + 0x28) +
             fVar9 * *(float *)(uVar18 + 0x58) + fVar10 * *(float *)(uVar18 + 0x88);
        auVar81._12_4_ =
             fVar8 * *(float *)(uVar18 + 0x2c) +
             fVar9 * *(float *)(uVar18 + 0x5c) + fVar10 * *(float *)(uVar18 + 0x8c);
        auVar87._0_4_ =
             fVar8 * *(float *)(uVar18 + 0x30) +
             fVar9 * *(float *)(uVar18 + 0x60) + fVar10 * *(float *)(uVar18 + 0x90);
        auVar87._4_4_ =
             fVar8 * *(float *)(uVar18 + 0x34) +
             fVar9 * *(float *)(uVar18 + 100) + fVar10 * *(float *)(uVar18 + 0x94);
        auVar87._8_4_ =
             fVar8 * *(float *)(uVar18 + 0x38) +
             fVar9 * *(float *)(uVar18 + 0x68) + fVar10 * *(float *)(uVar18 + 0x98);
        auVar87._12_4_ =
             fVar8 * *(float *)(uVar18 + 0x3c) +
             fVar9 * *(float *)(uVar18 + 0x6c) + fVar10 * *(float *)(uVar18 + 0x9c);
        fVar54 = (float)DAT_01f4bd50;
        fVar58 = DAT_01f4bd50._4_4_;
        fVar59 = DAT_01f4bd50._8_4_;
        fVar60 = DAT_01f4bd50._12_4_;
        auVar51._4_4_ = -(uint)(ABS(auVar81._4_4_) < fVar58);
        auVar51._0_4_ = -(uint)(ABS(auVar81._0_4_) < fVar54);
        auVar51._8_4_ = -(uint)(ABS(auVar81._8_4_) < fVar59);
        auVar51._12_4_ = -(uint)(ABS(auVar81._12_4_) < fVar60);
        auVar51 = blendvps(auVar81,_DAT_01f4bd50,auVar51);
        auVar56._4_4_ = -(uint)(ABS(auVar87._4_4_) < fVar58);
        auVar56._0_4_ = -(uint)(ABS(auVar87._0_4_) < fVar54);
        auVar56._8_4_ = -(uint)(ABS(auVar87._8_4_) < fVar59);
        auVar56._12_4_ = -(uint)(ABS(auVar87._12_4_) < fVar60);
        auVar56 = blendvps(auVar87,_DAT_01f4bd50,auVar56);
        auVar91._0_4_ = fVar8 * *(float *)(uVar18 + 0x40) + auVar42._0_4_;
        auVar91._4_4_ = fVar8 * *(float *)(uVar18 + 0x44) + auVar42._4_4_;
        auVar91._8_4_ = fVar8 * *(float *)(uVar18 + 0x48) + auVar42._8_4_;
        auVar91._12_4_ = fVar8 * *(float *)(uVar18 + 0x4c) + auVar42._12_4_;
        auVar92._4_4_ = -(uint)(ABS(auVar91._4_4_) < fVar58);
        auVar92._0_4_ = -(uint)(ABS(auVar91._0_4_) < fVar54);
        auVar92._8_4_ = -(uint)(ABS(auVar91._8_4_) < fVar59);
        auVar92._12_4_ = -(uint)(ABS(auVar91._12_4_) < fVar60);
        auVar92 = blendvps(auVar91,_DAT_01f4bd50,auVar92);
        auVar34 = rcpps(auVar42,auVar51);
        fVar54 = auVar34._0_4_;
        fVar58 = auVar34._4_4_;
        fVar59 = auVar34._8_4_;
        fVar60 = auVar34._12_4_;
        fVar54 = (1.0 - auVar51._0_4_ * fVar54) * fVar54 + fVar54;
        fVar58 = (1.0 - auVar51._4_4_ * fVar58) * fVar58 + fVar58;
        fVar59 = (1.0 - auVar51._8_4_ * fVar59) * fVar59 + fVar59;
        fVar60 = (1.0 - auVar51._12_4_ * fVar60) * fVar60 + fVar60;
        auVar34 = rcpps(auVar34,auVar56);
        fVar79 = auVar34._0_4_;
        fVar82 = auVar34._4_4_;
        fVar83 = auVar34._8_4_;
        fVar84 = auVar34._12_4_;
        fVar79 = (1.0 - auVar56._0_4_ * fVar79) * fVar79 + fVar79;
        fVar82 = (1.0 - auVar56._4_4_ * fVar82) * fVar82 + fVar82;
        fVar83 = (1.0 - auVar56._8_4_ * fVar83) * fVar83 + fVar83;
        fVar84 = (1.0 - auVar56._12_4_ * fVar84) * fVar84 + fVar84;
        auVar34 = rcpps(auVar34,auVar92);
        fVar85 = auVar34._0_4_;
        fVar88 = auVar34._4_4_;
        fVar89 = auVar34._8_4_;
        fVar90 = auVar34._12_4_;
        fVar85 = (1.0 - auVar92._0_4_ * fVar85) * fVar85 + fVar85;
        fVar88 = (1.0 - auVar92._4_4_ * fVar88) * fVar88 + fVar88;
        fVar89 = (1.0 - auVar92._8_4_ * fVar89) * fVar89 + fVar89;
        fVar90 = (1.0 - auVar92._12_4_ * fVar90) * fVar90 + fVar90;
        fVar62 = *(float *)(uVar18 + 0x20) * fVar5 +
                 *(float *)(uVar18 + 0x50) * fVar6 +
                 *(float *)(uVar18 + 0x80) * fVar7 + *(float *)(uVar18 + 0xb0);
        fVar64 = *(float *)(uVar18 + 0x24) * fVar5 +
                 *(float *)(uVar18 + 0x54) * fVar6 +
                 *(float *)(uVar18 + 0x84) * fVar7 + *(float *)(uVar18 + 0xb4);
        fVar65 = *(float *)(uVar18 + 0x28) * fVar5 +
                 *(float *)(uVar18 + 0x58) * fVar6 +
                 *(float *)(uVar18 + 0x88) * fVar7 + *(float *)(uVar18 + 0xb8);
        fVar66 = *(float *)(uVar18 + 0x2c) * fVar5 +
                 *(float *)(uVar18 + 0x5c) * fVar6 +
                 *(float *)(uVar18 + 0x8c) * fVar7 + *(float *)(uVar18 + 0xbc);
        fVar38 = *(float *)(uVar18 + 0x30) * fVar5 +
                 *(float *)(uVar18 + 0x60) * fVar6 +
                 *(float *)(uVar18 + 0x90) * fVar7 + *(float *)(uVar18 + 0xc0);
        fVar44 = *(float *)(uVar18 + 0x34) * fVar5 +
                 *(float *)(uVar18 + 100) * fVar6 +
                 *(float *)(uVar18 + 0x94) * fVar7 + *(float *)(uVar18 + 0xc4);
        fVar46 = *(float *)(uVar18 + 0x38) * fVar5 +
                 *(float *)(uVar18 + 0x68) * fVar6 +
                 *(float *)(uVar18 + 0x98) * fVar7 + *(float *)(uVar18 + 200);
        fVar48 = *(float *)(uVar18 + 0x3c) * fVar5 +
                 *(float *)(uVar18 + 0x6c) * fVar6 +
                 *(float *)(uVar18 + 0x9c) * fVar7 + *(float *)(uVar18 + 0xcc);
        fVar39 = *(float *)(uVar18 + 0x40) * fVar5 +
                 *(float *)(uVar18 + 0x70) * fVar6 +
                 *(float *)(uVar18 + 0xa0) * fVar7 + *(float *)(uVar18 + 0xd0);
        fVar45 = *(float *)(uVar18 + 0x44) * fVar5 +
                 *(float *)(uVar18 + 0x74) * fVar6 +
                 *(float *)(uVar18 + 0xa4) * fVar7 + *(float *)(uVar18 + 0xd4);
        fVar47 = *(float *)(uVar18 + 0x48) * fVar5 +
                 *(float *)(uVar18 + 0x78) * fVar6 +
                 *(float *)(uVar18 + 0xa8) * fVar7 + *(float *)(uVar18 + 0xd8);
        fVar49 = *(float *)(uVar18 + 0x4c) * fVar5 +
                 *(float *)(uVar18 + 0x7c) * fVar6 +
                 *(float *)(uVar18 + 0xac) * fVar7 + *(float *)(uVar18 + 0xdc);
        fVar75 = ((*(float *)(uVar18 + 0xe0) * fVar11 + fVar32) - fVar62) * fVar54;
        fVar76 = ((*(float *)(uVar18 + 0xe4) * fVar11 + fVar32) - fVar64) * fVar58;
        fVar77 = ((*(float *)(uVar18 + 0xe8) * fVar11 + fVar32) - fVar65) * fVar59;
        fVar78 = ((*(float *)(uVar18 + 0xec) * fVar11 + fVar32) - fVar66) * fVar60;
        fVar54 = ((*(float *)(uVar18 + 0x110) * fVar11 + fVar31) - fVar62) * fVar54;
        fVar58 = ((*(float *)(uVar18 + 0x114) * fVar11 + fVar31) - fVar64) * fVar58;
        fVar59 = ((*(float *)(uVar18 + 0x118) * fVar11 + fVar31) - fVar65) * fVar59;
        fVar60 = ((*(float *)(uVar18 + 0x11c) * fVar11 + fVar31) - fVar66) * fVar60;
        fVar70 = ((*(float *)(uVar18 + 0xf0) * fVar11 + fVar32) - fVar38) * fVar79;
        fVar71 = ((*(float *)(uVar18 + 0xf4) * fVar11 + fVar32) - fVar44) * fVar82;
        fVar72 = ((*(float *)(uVar18 + 0xf8) * fVar11 + fVar32) - fVar46) * fVar83;
        fVar73 = ((*(float *)(uVar18 + 0xfc) * fVar11 + fVar32) - fVar48) * fVar84;
        fVar62 = ((*(float *)(uVar18 + 0x100) * fVar11 + fVar32) - fVar39) * fVar85;
        fVar64 = ((*(float *)(uVar18 + 0x104) * fVar11 + fVar32) - fVar45) * fVar88;
        fVar65 = ((*(float *)(uVar18 + 0x108) * fVar11 + fVar32) - fVar47) * fVar89;
        fVar66 = ((*(float *)(uVar18 + 0x10c) * fVar11 + fVar32) - fVar49) * fVar90;
        fVar79 = ((*(float *)(uVar18 + 0x120) * fVar11 + fVar31) - fVar38) * fVar79;
        fVar82 = ((*(float *)(uVar18 + 0x124) * fVar11 + fVar31) - fVar44) * fVar82;
        fVar83 = ((*(float *)(uVar18 + 0x128) * fVar11 + fVar31) - fVar46) * fVar83;
        fVar84 = ((*(float *)(uVar18 + 300) * fVar11 + fVar31) - fVar48) * fVar84;
        fVar85 = ((*(float *)(uVar18 + 0x130) * fVar11 + fVar31) - fVar39) * fVar85;
        fVar88 = ((*(float *)(uVar18 + 0x134) * fVar11 + fVar31) - fVar45) * fVar88;
        fVar89 = ((*(float *)(uVar18 + 0x138) * fVar11 + fVar31) - fVar47) * fVar89;
        fVar90 = ((*(float *)(uVar18 + 0x13c) * fVar11 + fVar31) - fVar49) * fVar90;
        auVar53._0_4_ =
             (uint)((int)fVar79 < (int)fVar70) * (int)fVar79 |
             (uint)((int)fVar79 >= (int)fVar70) * (int)fVar70;
        auVar53._4_4_ =
             (uint)((int)fVar82 < (int)fVar71) * (int)fVar82 |
             (uint)((int)fVar82 >= (int)fVar71) * (int)fVar71;
        auVar53._8_4_ =
             (uint)((int)fVar83 < (int)fVar72) * (int)fVar83 |
             (uint)((int)fVar83 >= (int)fVar72) * (int)fVar72;
        auVar53._12_4_ =
             (uint)((int)fVar84 < (int)fVar73) * (int)fVar84 |
             (uint)((int)fVar84 >= (int)fVar73) * (int)fVar73;
        auVar36._0_4_ =
             (uint)((int)fVar85 < (int)fVar62) * (int)fVar85 |
             (uint)((int)fVar85 >= (int)fVar62) * (int)fVar62;
        auVar36._4_4_ =
             (uint)((int)fVar88 < (int)fVar64) * (int)fVar88 |
             (uint)((int)fVar88 >= (int)fVar64) * (int)fVar64;
        auVar36._8_4_ =
             (uint)((int)fVar89 < (int)fVar65) * (int)fVar89 |
             (uint)((int)fVar89 >= (int)fVar65) * (int)fVar65;
        auVar36._12_4_ =
             (uint)((int)fVar90 < (int)fVar66) * (int)fVar90 |
             (uint)((int)fVar90 >= (int)fVar66) * (int)fVar66;
        auVar51 = maxps(auVar53,auVar36);
        auVar57._0_4_ =
             (uint)((int)fVar54 < (int)fVar75) * (int)fVar54 |
             (uint)((int)fVar54 >= (int)fVar75) * (int)fVar75;
        auVar57._4_4_ =
             (uint)((int)fVar58 < (int)fVar76) * (int)fVar58 |
             (uint)((int)fVar58 >= (int)fVar76) * (int)fVar76;
        auVar57._8_4_ =
             (uint)((int)fVar59 < (int)fVar77) * (int)fVar59 |
             (uint)((int)fVar59 >= (int)fVar77) * (int)fVar77;
        auVar57._12_4_ =
             (uint)((int)fVar60 < (int)fVar78) * (int)fVar60 |
             (uint)((int)fVar60 >= (int)fVar78) * (int)fVar78;
        auVar63._0_4_ =
             (uint)((int)fVar79 < (int)fVar70) * (int)fVar70 |
             (uint)((int)fVar79 >= (int)fVar70) * (int)fVar79;
        auVar63._4_4_ =
             (uint)((int)fVar82 < (int)fVar71) * (int)fVar71 |
             (uint)((int)fVar82 >= (int)fVar71) * (int)fVar82;
        auVar63._8_4_ =
             (uint)((int)fVar83 < (int)fVar72) * (int)fVar72 |
             (uint)((int)fVar83 >= (int)fVar72) * (int)fVar83;
        auVar63._12_4_ =
             (uint)((int)fVar84 < (int)fVar73) * (int)fVar73 |
             (uint)((int)fVar84 >= (int)fVar73) * (int)fVar84;
        auVar43._0_4_ =
             (uint)((int)fVar85 < (int)fVar62) * (int)fVar62 |
             (uint)((int)fVar85 >= (int)fVar62) * (int)fVar85;
        auVar43._4_4_ =
             (uint)((int)fVar88 < (int)fVar64) * (int)fVar64 |
             (uint)((int)fVar88 >= (int)fVar64) * (int)fVar88;
        auVar43._8_4_ =
             (uint)((int)fVar89 < (int)fVar65) * (int)fVar65 |
             (uint)((int)fVar89 >= (int)fVar65) * (int)fVar89;
        auVar43._12_4_ =
             (uint)((int)fVar90 < (int)fVar66) * (int)fVar66 |
             (uint)((int)fVar90 >= (int)fVar66) * (int)fVar90;
        auVar56 = minps(auVar63,auVar43);
        auVar34 = maxps(auVar80,auVar57);
        auVar51 = maxps(auVar34,auVar51);
        auVar34._4_4_ =
             (uint)((int)fVar58 < (int)fVar76) * (int)fVar76 |
             (uint)((int)fVar58 >= (int)fVar76) * (int)fVar58;
        auVar34._0_4_ =
             (uint)((int)fVar54 < (int)fVar75) * (int)fVar75 |
             (uint)((int)fVar54 >= (int)fVar75) * (int)fVar54;
        auVar34._8_4_ =
             (uint)((int)fVar59 < (int)fVar77) * (int)fVar77 |
             (uint)((int)fVar59 >= (int)fVar77) * (int)fVar59;
        auVar34._12_4_ =
             (uint)((int)fVar60 < (int)fVar78) * (int)fVar78 |
             (uint)((int)fVar60 >= (int)fVar78) * (int)fVar60;
        auVar34 = minps(auVar86,auVar34);
        auVar34 = minps(auVar34,auVar56);
        iVar27 = -(uint)(auVar51._0_4_ * 0.99999964 <= auVar34._0_4_ * 1.0000004);
        iVar28 = -(uint)(auVar51._4_4_ * 0.99999964 <= auVar34._4_4_ * 1.0000004);
        iVar29 = -(uint)(auVar51._8_4_ * 0.99999964 <= auVar34._8_4_ * 1.0000004);
        iVar30 = -(uint)(auVar51._12_4_ * 0.99999964 <= auVar34._12_4_ * 1.0000004);
      }
      else {
        pfVar3 = (float *)(uVar18 + 0x80 + uVar21);
        pfVar1 = (float *)(uVar18 + 0x20 + uVar21);
        pfVar4 = (float *)(uVar18 + 0x80 + uVar26);
        pfVar2 = (float *)(uVar18 + 0x20 + uVar26);
        auVar40._0_4_ = ((*pfVar3 * fVar11 + *pfVar1) - fVar5) * fVar69;
        auVar40._4_4_ = ((pfVar3[1] * fVar11 + pfVar1[1]) - fVar5) * fVar69;
        auVar40._8_4_ = ((pfVar3[2] * fVar11 + pfVar1[2]) - fVar5) * fVar69;
        auVar40._12_4_ = ((pfVar3[3] * fVar11 + pfVar1[3]) - fVar5) * fVar69;
        auVar50._0_4_ = ((*pfVar4 * fVar11 + *pfVar2) - fVar6) * fVar74;
        auVar50._4_4_ = ((pfVar4[1] * fVar11 + pfVar2[1]) - fVar6) * fVar74;
        auVar50._8_4_ = ((pfVar4[2] * fVar11 + pfVar2[2]) - fVar6) * fVar74;
        auVar50._12_4_ = ((pfVar4[3] * fVar11 + pfVar2[3]) - fVar6) * fVar74;
        pfVar2 = (float *)(uVar18 + 0x80 + uVar22);
        pfVar1 = (float *)(uVar18 + 0x20 + uVar22);
        auVar33._0_4_ = ((*pfVar2 * fVar11 + *pfVar1) - fVar7) * fVar68;
        auVar33._4_4_ = ((pfVar2[1] * fVar11 + pfVar1[1]) - fVar7) * fVar68;
        auVar33._8_4_ = ((pfVar2[2] * fVar11 + pfVar1[2]) - fVar7) * fVar68;
        auVar33._12_4_ = ((pfVar2[3] * fVar11 + pfVar1[3]) - fVar7) * fVar68;
        auVar51 = maxps(auVar50,auVar33);
        auVar34 = maxps(auVar80,auVar40);
        pfVar2 = (float *)(uVar18 + 0x80 + (uVar21 ^ 0x10));
        pfVar1 = (float *)(uVar18 + 0x20 + (uVar21 ^ 0x10));
        auVar34 = maxps(auVar34,auVar51);
        auVar41._0_4_ = ((*pfVar2 * fVar11 + *pfVar1) - fVar5) * fVar37;
        auVar41._4_4_ = ((pfVar2[1] * fVar11 + pfVar1[1]) - fVar5) * fVar37;
        auVar41._8_4_ = ((pfVar2[2] * fVar11 + pfVar1[2]) - fVar5) * fVar37;
        auVar41._12_4_ = ((pfVar2[3] * fVar11 + pfVar1[3]) - fVar5) * fVar37;
        pfVar3 = (float *)(uVar18 + 0x80 + (uVar26 ^ 0x10));
        pfVar1 = (float *)(uVar18 + 0x20 + (uVar26 ^ 0x10));
        pfVar4 = (float *)(uVar18 + 0x80 + (uVar22 ^ 0x10));
        pfVar2 = (float *)(uVar18 + 0x20 + (uVar22 ^ 0x10));
        auVar55._0_4_ = ((*pfVar3 * fVar11 + *pfVar1) - fVar6) * fVar61;
        auVar55._4_4_ = ((pfVar3[1] * fVar11 + pfVar1[1]) - fVar6) * fVar61;
        auVar55._8_4_ = ((pfVar3[2] * fVar11 + pfVar1[2]) - fVar6) * fVar61;
        auVar55._12_4_ = ((pfVar3[3] * fVar11 + pfVar1[3]) - fVar6) * fVar61;
        auVar52._0_4_ = ((*pfVar4 * fVar11 + *pfVar2) - fVar7) * fVar67;
        auVar52._4_4_ = ((pfVar4[1] * fVar11 + pfVar2[1]) - fVar7) * fVar67;
        auVar52._8_4_ = ((pfVar4[2] * fVar11 + pfVar2[2]) - fVar7) * fVar67;
        auVar52._12_4_ = ((pfVar4[3] * fVar11 + pfVar2[3]) - fVar7) * fVar67;
        auVar56 = minps(auVar55,auVar52);
        auVar51 = minps(auVar86,auVar41);
        auVar51 = minps(auVar51,auVar56);
        bVar13 = auVar34._0_4_ <= auVar51._0_4_;
        iVar27 = -(uint)bVar13;
        bVar14 = auVar34._4_4_ <= auVar51._4_4_;
        iVar28 = -(uint)bVar14;
        bVar15 = auVar34._8_4_ <= auVar51._8_4_;
        iVar29 = -(uint)bVar15;
        bVar16 = auVar34._12_4_ <= auVar51._12_4_;
        iVar30 = -(uint)bVar16;
        if (uVar19 == 6) {
          iVar27 = -(uint)((fVar11 < *(float *)(uVar18 + 0xf0) &&
                           *(float *)(uVar18 + 0xe0) <= fVar11) && bVar13);
          iVar28 = -(uint)((fVar11 < *(float *)(uVar18 + 0xf4) &&
                           *(float *)(uVar18 + 0xe4) <= fVar11) && bVar14);
          iVar29 = -(uint)((fVar11 < *(float *)(uVar18 + 0xf8) &&
                           *(float *)(uVar18 + 0xe8) <= fVar11) && bVar15);
          iVar30 = -(uint)((fVar11 < *(float *)(uVar18 + 0xfc) &&
                           *(float *)(uVar18 + 0xec) <= fVar11) && bVar16);
        }
      }
      auVar35._0_4_ = iVar27 << 0x1f;
      auVar35._4_4_ = iVar28 << 0x1f;
      auVar35._8_4_ = iVar29 << 0x1f;
      auVar35._12_4_ = iVar30 << 0x1f;
      uVar19 = movmskps(uVar19,auVar35);
      if (uVar19 == 0) goto LAB_00724331;
      uVar19 = uVar19 & 0xff;
      lVar12 = 0;
      if (uVar19 != 0) {
        for (; (uVar19 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
        }
      }
      uVar25 = *(ulong *)(uVar18 + lVar12 * 8);
      uVar19 = uVar19 - 1 & uVar19;
      uVar20 = (ulong)uVar19;
    } while (uVar19 == 0);
    do {
      *puVar24 = uVar25;
      puVar24 = puVar24 + 1;
      lVar12 = 0;
      if (uVar20 != 0) {
        for (; (uVar20 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
        }
      }
      uVar25 = *(ulong *)(uVar18 + lVar12 * 8);
      uVar20 = uVar20 - 1 & uVar20;
    } while (uVar20 != 0);
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }